

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

int isSelPropNewValueNotify(Display *display,XEvent_conflict *event,XPointer pointer)

{
  bool local_29;
  XEvent_conflict *notification;
  XPointer pointer_local;
  XEvent_conflict *event_local;
  Display *display_local;
  
  local_29 = false;
  if (((event->type == 0x1c) && (local_29 = false, (event->xexpose).count == 0)) &&
     (local_29 = false, (event->xany).window == *(Window *)(pointer + 0x20))) {
    local_29 = (event->xkey).root == *(Window *)(pointer + 0x38);
  }
  return (int)local_29;
}

Assistant:

static Bool isSelPropNewValueNotify(Display* display, XEvent* event, XPointer pointer)
{
    XEvent* notification = (XEvent*) pointer;
    return event->type == PropertyNotify &&
           event->xproperty.state == PropertyNewValue &&
           event->xproperty.window == notification->xselection.requestor &&
           event->xproperty.atom == notification->xselection.property;
}